

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_Bech32.cpp
# Opt level: O1

void __thiscall
Bech32Test_find_separator_position_Test::~Bech32Test_find_separator_position_Test
          (Bech32Test_find_separator_position_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Bech32Test, find_separator_position) {
    std::string data("ab1cd");
    auto pos = findSeparatorPosition(data);
    ASSERT_EQ(2, pos);

    data = "abc1def1lalala";
    pos = findSeparatorPosition(data);
    ASSERT_EQ(7, pos);

    data = "lalalalalala";
    pos = findSeparatorPosition(data);
    ASSERT_EQ(std::string::npos, pos);
}